

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O3

void choice_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,Am_Value *sel_value
               )

{
  Am_Value_Type AVar1;
  bool bVar2;
  bool bVar3;
  Am_Value *pAVar4;
  ostream *poVar5;
  long lVar6;
  Am_Object *pAVar7;
  char *pcVar8;
  Am_Object old_value_obj;
  Am_Object inter;
  Am_Object new_value_obj;
  Am_Value old_value;
  Am_Value new_value;
  Am_Value_List old_value_list;
  Am_Value_List new_value_list;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Value local_78;
  Am_Object *local_68;
  Am_Value local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  local_88.data = (Am_Object_Data *)0x0;
  local_68 = command_obj;
  pAVar4 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_88,pAVar4);
  pAVar4 = Am_Object::Get(&local_88,0xdd,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar4);
  local_60.type = 0;
  local_60.value.wrapper_value = (Am_Wrapper *)0x0;
  local_78.type = 0;
  local_78.value.wrapper_value = (Am_Wrapper *)0x0;
  local_80.data = (Am_Object_Data *)0x0;
  local_90.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_40);
  Am_Value_List::Am_Value_List(&local_50);
  pAVar7 = local_68;
  if (selective) {
    pAVar7 = &local_88;
    bVar3 = Am_Object::Valid(pAVar7);
    if (bVar3) goto LAB_001b3b09;
  }
  else {
LAB_001b3b09:
    pAVar4 = Am_Object::Get(pAVar7,0x169,1);
    Am_Value::operator=(&local_60,pAVar4);
  }
  if (!reload_data || undo) {
    sel_value = Am_Object::Get(local_68,(ushort)undo + (ushort)undo * 2 + 0x169,1);
  }
  Am_Value::operator=(&local_78,sel_value);
  AVar1 = local_60.type;
  bVar3 = Am_Value::Valid(&local_60);
  pAVar7 = local_68;
  if (bVar3) {
    if (AVar1 != 0xa001) {
      bVar3 = Am_Value_List::Test(local_60.value.wrapper_value);
      if (!bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet Error: Bad type ",0x1a);
        Am_Print_Type((ostream *)&std::cerr,AVar1);
        lVar6 = 0x15;
        pcVar8 = " in VALUE of command ";
        goto LAB_001b3e44;
      }
      Am_Value_List::operator=(&local_40,&local_60);
      Am_Value_List::Start(&local_40);
      while( true ) {
        bVar3 = Am_Value_List::Last(&local_40);
        if (bVar3) break;
        pAVar4 = Am_Value_List::Get(&local_40);
        Am_Object::operator=(&local_80,pAVar4);
        if (bVar2) {
          Am_Object::Set(&local_80,0x172,false,1);
        }
        Am_Value_List::Next(&local_40);
      }
      goto LAB_001b3c41;
    }
    Am_Object::operator=(&local_80,&local_60);
    if (!bVar2) goto LAB_001b3caf;
    bVar2 = Am_Object::Valid(&local_80);
    if (bVar2) {
      Am_Object::Set(&local_80,0x172,false,1);
    }
  }
  else {
LAB_001b3c41:
    if (!bVar2) goto LAB_001b3caf;
  }
  AVar1 = local_78.type;
  bVar2 = Am_Value::Valid(&local_78);
  if (bVar2) {
    if (AVar1 == 0xa001) {
      Am_Object::operator=(&local_90,&local_78);
      bVar2 = Am_Object::Valid(&local_90);
      if (bVar2) {
        Am_Object::Set(&local_90,0x172,true,1);
      }
    }
    else {
      bVar2 = Am_Value_List::Test(local_78.value.wrapper_value);
      if (!bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet Error: Bad type ",0x1a);
        Am_Print_Type((ostream *)&std::cerr,AVar1);
        lVar6 = 0x19;
        pcVar8 = " in OLD_VALUE of command ";
LAB_001b3e44:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar6);
        poVar5 = operator<<((ostream *)&std::cerr,local_68);
        std::endl<char,std::char_traits<char>>(poVar5);
        Am_Error();
      }
      Am_Value_List::operator=(&local_50,&local_78);
      Am_Value_List::Start(&local_50);
      while( true ) {
        bVar2 = Am_Value_List::Last(&local_50);
        if (bVar2) break;
        pAVar4 = Am_Value_List::Get(&local_50);
        Am_Object::operator=(&local_90,pAVar4);
        Am_Object::Set(&local_90,0x172,true,1);
        Am_Value_List::Next(&local_50);
      }
    }
  }
  else {
    Am_Object::operator=(&local_90,&Am_No_Object);
  }
LAB_001b3caf:
  Am_Object::Set(pAVar7,0x16c,&local_60,0);
  Am_Object::Set(pAVar7,0x169,&local_78,0);
  Am_Object::Set(pAVar7,0x16d,&local_78,0);
  bVar2 = Am_Object::Valid(&local_88);
  if (bVar2) {
    Am_Object::Set(&local_88,0x169,&local_78,0);
  }
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_80);
  Am_Value::~Am_Value(&local_78);
  Am_Value::~Am_Value(&local_60);
  Am_Object::~Am_Object(&local_88);
  return;
}

Assistant:

void
choice_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                         bool reload_data, Am_Value sel_value)
{
  Am_Object inter;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  bool set_selected = inter.Get(Am_SET_SELECTED);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Repeat";
    std::cout << " of command " << command_obj << std::endl << std::flush;
  }
#endif
  // Go through current value and unset any SELECTED slots and then set any
  // in the old value

  // first clear SELECTED for the current values
  Am_Value new_value, old_value;
  Am_Object new_value_obj, old_value_obj;
  Am_Value_List new_value_list, old_value_list;

  if (selective) { // then get current value from the interactor
    if (inter.Valid())
      new_value = inter.Peek(Am_VALUE);
  } else // get current value from the command_obj
    new_value = command_obj.Peek(Am_VALUE);

  if (undo)
    old_value = command_obj.Peek(Am_OLD_VALUE);
  else { // repeat
    //set to new obj or current value of command
    if (reload_data)
      old_value = sel_value;
    else
      old_value = command_obj.Peek(Am_VALUE);
  }

  Am_Value_Type typ = new_value.type;

  if (!new_value.Valid())
    ; //don't do anything if not Valid
  else if (typ == Am_OBJECT) {
    new_value_obj = new_value;
    // have to check since might be a null object
    if (set_selected && new_value_obj.Valid()) {
      Am_REPORT_SET_SEL_VALUE(true, inter, new_value_obj, false);
      new_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
    }
  } else if (Am_Value_List::Test(new_value.value.wrapper_value)) {
    new_value_list = new_value;
    for (new_value_list.Start(); !new_value_list.Last();
         new_value_list.Next()) {
      new_value_obj = new_value_list.Get();
      if (set_selected) {
        Am_REPORT_SET_SEL_VALUE(true, inter, new_value_obj, false);
        //clear all current values
        new_value_obj.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
      }
    }
  } else {
    std::cerr << "** Amulet Error: Bad type ";
    Am_Print_Type(std::cerr, typ);
    std::cerr << " in VALUE of command " << command_obj << std::endl;
    Am_Error();
  }

  // now set SELECTED for the old_value_objs
  typ = old_value.type;

  if (set_selected) {
    if (!old_value.Valid())
      old_value_obj = Am_No_Object; //all invalids map to zero
    else if (typ == Am_OBJECT) {
      old_value_obj = old_value;
      if (old_value_obj.Valid()) {
        //have to check valid since might be a null object
        Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, true);
        old_value_obj.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
    }
    //// BUG: Need to move add_ref to setter to avoid this annoyance
    else if (Am_Value_List::Test(
                 old_value.value.wrapper_value)) { //then is a list
      old_value_list = old_value;
      for (old_value_list.Start(); !old_value_list.Last();
           old_value_list.Next()) {
        old_value_obj = old_value_list.Get();
        Am_REPORT_SET_SEL_VALUE(true, inter, old_value_obj, true);
        old_value_obj.Set(Am_SELECTED, true,
                          Am_OK_IF_NOT_THERE); //set all old values
      }
    } else {
      std::cerr << "** Amulet Error: Bad type ";
      Am_Print_Type(std::cerr, typ);
      std::cerr << " in OLD_VALUE of command " << command_obj << std::endl;
      Am_Error();
    }
  }

// swap current and old values, in case undo or undo-the-undo again.

#ifdef DEBUG
  if (Am_Inter_Tracing(Am_INTER_TRACE_SETTING)) {
    report_set_value(inter, Am_OLD_VALUE, command_obj, new_value);
    report_set_value(inter, Am_VALUE, command_obj, old_value);
    report_set_value(inter, Am_VALUE, inter, old_value);
  }
#endif
  command_obj.Set(Am_OLD_VALUE, new_value);
  command_obj.Set(Am_VALUE, old_value);
  command_obj.Set(Am_OBJECT_MODIFIED, old_value);
  // make current interactor have the correct current value
  if (inter.Valid())
    inter.Set(Am_VALUE, old_value);
}